

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void __thiscall FStateLabels::Destroy(FStateLabels *this)

{
  int iVar1;
  FStateLabels **ppFVar2;
  long lVar3;
  
  iVar1 = this->NumLabels;
  if (0 < iVar1) {
    ppFVar2 = &this->Labels[0].Children;
    lVar3 = 0;
    do {
      if (*ppFVar2 != (FStateLabels *)0x0) {
        Destroy(*ppFVar2);
        free(*ppFVar2);
        *ppFVar2 = (FStateLabels *)0x0;
        iVar1 = this->NumLabels;
      }
      lVar3 = lVar3 + 1;
      ppFVar2 = ppFVar2 + 3;
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void FStateLabels::Destroy ()
{
	for(int i = 0; i < NumLabels; i++)
	{
		if (Labels[i].Children != NULL)
		{
			Labels[i].Children->Destroy();
			free(Labels[i].Children);	// These are malloc'd, not new'd!
			Labels[i].Children = NULL;
		}
	}
}